

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderLayeredRenderingFBONoAttachment::deinit
          (GeometryShaderLayeredRenderingFBONoAttachment *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GeometryShaderLayeredRenderingFBONoAttachment *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0xb8))(0x8c1a,0);
  (**(code **)(lVar3 + 0x78))(0x8d40,0);
  (**(code **)(lVar3 + 0xd8))(0);
  if (this->m_po_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_po_id);
    this->m_po_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fs_id);
    this->m_fs_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_gs_id);
    this->m_gs_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vs_id);
    this->m_vs_id = 0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_all_layers_data != (GLint *)0x0) {
    if (this->m_all_layers_data != (GLint *)0x0) {
      operator_delete__(this->m_all_layers_data);
    }
    this->m_all_layers_data = (GLint *)0x0;
  }
  if (this->m_layer_data != (GLint *)0x0) {
    if (this->m_layer_data != (GLint *)0x0) {
      operator_delete__(this->m_layer_data);
    }
    this->m_layer_data = (GLint *)0x0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderLayeredRenderingFBONoAttachment::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0 /* texture */);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
		m_gs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);
		m_to_id = 0;
	}

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	if (m_all_layers_data != DE_NULL)
	{
		delete[] m_all_layers_data;
		m_all_layers_data = DE_NULL;
	}

	if (m_layer_data != DE_NULL)
	{
		delete[] m_layer_data;
		m_layer_data = DE_NULL;
	}

	/* Release base class */
	TestCaseBase::deinit();
}